

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O3

void MOJOSHADER_glSetLegacyBumpMapEnv
               (uint sampler,float mat00,float mat01,float mat10,float mat11,float lscale,
               float loffset)

{
  MOJOSHADER_glContext *pMVar1;
  ulong uVar2;
  
  pMVar1 = ctx;
  if (0xfffffffb < sampler - 5) {
    uVar2 = (ulong)(sampler * 6);
    ctx->sampler_reg_file[uVar2 + 10] = (GLuint)mat00;
    pMVar1->sampler_reg_file[uVar2 + 0xb] = (GLuint)mat01;
    pMVar1->sampler_reg_file[uVar2 + 0xc] = (GLuint)mat10;
    pMVar1->sampler_reg_file[uVar2 + 0xd] = (GLuint)mat11;
    pMVar1->sampler_reg_file[uVar2 + 0xe] = (GLuint)lscale;
    pMVar1->sampler_reg_file[uVar2 + 0xf] = (GLuint)loffset;
    pMVar1->generation = pMVar1->generation + 1;
  }
  return;
}

Assistant:

void MOJOSHADER_glSetLegacyBumpMapEnv(unsigned int sampler, float mat00,
                                      float mat01, float mat10, float mat11,
                                      float lscale, float loffset)
{
    if ((sampler == 0) || (sampler > (MAX_TEXBEMS+1)))
        return;

    GLfloat *dstf = ctx->texbem_state + (6 * (sampler-1));
    *(dstf++) = (GLfloat) mat00;
    *(dstf++) = (GLfloat) mat01;
    *(dstf++) = (GLfloat) mat10;
    *(dstf++) = (GLfloat) mat11;
    *(dstf++) = (GLfloat) lscale;
    *(dstf++) = (GLfloat) loffset;
    ctx->generation++;
}